

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O3

ChVector<double> *
chrono::Quat_to_Angle
          (ChVector<double> *__return_storage_ptr__,AngleSet angset,ChQuaternion<double> *mquat)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined8 uVar3;
  byte bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar28 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar29 [64];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar30 [64];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  ChMatrix33<double> Acoord;
  undefined1 local_98 [16];
  ChMatrix33<double> local_58;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_58,mquat);
  switch(angset) {
  case EULERO:
    dVar37 = acos(local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8]);
    dVar21 = sin(dVar37);
    dVar21 = acos(local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[7] / dVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar11._8_8_ = 0x8000000000000000;
    auVar11._0_8_ = 0x8000000000000000;
    auVar19 = vxorpd_avx512vl(auVar22,auVar11);
    dVar31 = sin(dVar37);
    local_98._0_8_ = auVar19._0_8_;
    dVar31 = acos((double)local_98._0_8_ / dVar31);
    dVar21 = (double)((ulong)(dVar37 != 0.0) * (long)dVar21);
    dVar31 = (double)((ulong)(dVar37 != 0.0) * (long)dVar31);
    break;
  case CARDANO:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
    auVar19 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar1);
    auVar19 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar19);
    dVar37 = asin(auVar19._0_8_);
    local_98._8_8_ = 0;
    local_98._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    dVar21 = cos(dVar37);
    auVar17._8_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar17._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar19 = vunpcklpd_avx(auVar17,local_98);
    auVar30._0_8_ = cos(dVar37);
    auVar30._8_56_ = extraout_var_01;
    auVar15._8_8_ = extraout_XMM0_Qb_01;
    auVar15._0_8_ = dVar21;
    auVar27 = vunpcklpd_avx(auVar30._0_16_,auVar15);
    auVar19 = vdivpd_avx(auVar19,auVar27);
    auVar36._8_8_ = 0x3ff0000000000000;
    auVar36._0_8_ = 0x3ff0000000000000;
    auVar19 = vminpd_avx(auVar36,auVar19);
    auVar10._8_8_ = 0xbff0000000000000;
    auVar10._0_8_ = 0xbff0000000000000;
    uVar2 = vcmppd_avx512vl(auVar19,auVar10,1);
    auVar27 = vshufpd_avx(auVar19,auVar19,1);
    uVar12 = (uVar2 & 3) >> 1;
    bVar4 = (byte)(uVar2 & 3);
    dVar21 = acos((double)(uVar12 * -0x4010000000000000 + (ulong)!SUB81(uVar12,0) * auVar27._0_8_));
    dVar31 = acos((double)((ulong)(bVar4 & 1) * -0x4010000000000000 +
                          (ulong)!(bool)(bVar4 & 1) * auVar19._0_8_));
    break;
  case HPB:
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar19 = vxorpd_avx512vl(auVar24,auVar8);
    uVar3 = vcmpsd_avx512f(auVar24,ZEXT816(0xbff0000000000000),1);
    bVar5 = (bool)((byte)uVar3 & 1);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (ulong)bVar5 * 0x3ff0000000000000 + (ulong)!bVar5 * auVar19._0_8_;
    auVar19 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar32);
    dVar37 = asin(auVar19._0_8_);
    local_98._8_8_ = 0;
    local_98._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    dVar21 = cos(dVar37);
    auVar16._8_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar16._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar19 = vunpcklpd_avx(auVar16,local_98);
    auVar28._0_8_ = cos(dVar37);
    auVar28._8_56_ = extraout_var;
    auVar13._8_8_ = extraout_XMM0_Qb;
    auVar13._0_8_ = dVar21;
    auVar27 = vunpcklpd_avx(auVar28._0_16_,auVar13);
    auVar19 = vdivpd_avx(auVar19,auVar27);
    auVar33._8_8_ = 0x3ff0000000000000;
    auVar33._0_8_ = 0x3ff0000000000000;
    auVar19 = vminpd_avx(auVar33,auVar19);
    auVar9._8_8_ = 0xbff0000000000000;
    auVar9._0_8_ = 0xbff0000000000000;
    uVar2 = vcmppd_avx512vl(auVar19,auVar9,1);
    auVar27 = vshufpd_avx(auVar19,auVar19,1);
    uVar12 = (uVar2 & 3) >> 1;
    bVar4 = (byte)(uVar2 & 3);
    dVar31 = acos((double)(uVar12 * -0x4010000000000000 + (ulong)!SUB81(uVar12,0) * auVar27._0_8_));
    dVar21 = acos((double)((ulong)(bVar4 & 1) * -0x4010000000000000 +
                          (ulong)!(bool)(bVar4 & 1) * auVar19._0_8_));
    break;
  case RXYZ:
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar19 = vxorpd_avx512vl(auVar25,auVar6);
    uVar3 = vcmpsd_avx512f(auVar25,ZEXT816(0xbff0000000000000),1);
    bVar5 = (bool)((byte)uVar3 & 1);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = (ulong)bVar5 * 0x3ff0000000000000 + (ulong)!bVar5 * auVar19._0_8_;
    auVar19 = vmaxsd_avx(ZEXT816(0xbff0000000000000),auVar34);
    dVar37 = asin(auVar19._0_8_);
    local_98._8_8_ = 0;
    local_98._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    dVar21 = cos(dVar37);
    auVar18._8_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar18._0_8_ =
         local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar19 = vunpcklpd_avx(auVar18,local_98);
    auVar29._0_8_ = cos(dVar37);
    auVar29._8_56_ = extraout_var_00;
    auVar14._8_8_ = extraout_XMM0_Qb_00;
    auVar14._0_8_ = dVar21;
    auVar27 = vunpcklpd_avx(auVar29._0_16_,auVar14);
    auVar19 = vdivpd_avx(auVar19,auVar27);
    auVar35._8_8_ = 0x3ff0000000000000;
    auVar35._0_8_ = 0x3ff0000000000000;
    auVar19 = vminpd_avx(auVar35,auVar19);
    auVar7._8_8_ = 0xbff0000000000000;
    auVar7._0_8_ = 0xbff0000000000000;
    uVar2 = vcmppd_avx512vl(auVar19,auVar7,1);
    auVar27 = vshufpd_avx(auVar19,auVar19,1);
    uVar12 = (uVar2 & 3) >> 1;
    bVar4 = (byte)(uVar2 & 3);
    dVar21 = asin((double)(uVar12 * -0x4010000000000000 + (ulong)!SUB81(uVar12,0) * auVar27._0_8_));
    dVar31 = asin((double)((ulong)(bVar4 & 1) * -0x4010000000000000 +
                          (ulong)!(bool)(bVar4 & 1) * auVar19._0_8_));
    break;
  case RODRIGUEZ:
    dVar21 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
             + local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] + local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
    if (0.0 <= dVar21) {
      dVar21 = dVar21 + 1.0;
      if (dVar21 < 0.0) {
        dVar21 = sqrt(dVar21);
      }
      else {
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar21;
        auVar19 = vsqrtsd_avx(auVar19,auVar19);
        dVar21 = auVar19._0_8_;
      }
      dVar38 = dVar21 * 0.5;
      dVar21 = 0.5 / dVar21;
      dVar31 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7] - local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[5]) * dVar21;
      dVar37 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2] - local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[6]) * dVar21;
      dVar21 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3] - local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[1]) * dVar21;
    }
    else {
      if (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] <=
          local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]) {
        if (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] <
            local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8])
        goto LAB_004ef265;
        dVar21 = ((local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0] -
                  local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4]) -
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8]) + 1.0;
        if (dVar21 < 0.0) {
          dVar20 = sqrt(dVar21);
        }
        else {
          auVar27._8_8_ = 0;
          auVar27._0_8_ = dVar21;
          auVar19 = vsqrtsd_avx(auVar27,auVar27);
          dVar20 = auVar19._0_8_;
        }
        dVar38 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7] - local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5];
        dVar31 = dVar20 * 0.5;
        dVar20 = 0.5 / dVar20;
        dVar37 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] +
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3]) * dVar20;
        dVar21 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6] +
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2]) * dVar20;
      }
      else if (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] < local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8]) {
LAB_004ef265:
        dVar21 = ((local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8] -
                  local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0]) -
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4]) + 1.0;
        if (dVar21 < 0.0) {
          dVar20 = sqrt(dVar21);
        }
        else {
          auVar26._8_8_ = 0;
          auVar26._0_8_ = dVar21;
          auVar19 = vsqrtsd_avx(auVar26,auVar26);
          dVar20 = auVar19._0_8_;
        }
        dVar38 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3] - local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[1];
        dVar21 = dVar20 * 0.5;
        dVar20 = 0.5 / dVar20;
        dVar31 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[6] +
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2]) * dVar20;
        dVar37 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5] +
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7]) * dVar20;
      }
      else {
        dVar21 = ((local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4] -
                  local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8]) -
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0]) + 1.0;
        if (dVar21 < 0.0) {
          dVar20 = sqrt(dVar21);
        }
        else {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar21;
          auVar19 = vsqrtsd_avx(auVar23,auVar23);
          dVar20 = auVar19._0_8_;
        }
        dVar38 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2] - local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[6];
        dVar37 = dVar20 * 0.5;
        dVar20 = 0.5 / dVar20;
        dVar21 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5] +
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7]) * dVar20;
        dVar31 = (local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1] +
                 local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3]) * dVar20;
      }
      dVar38 = dVar38 * dVar20;
    }
    dVar21 = dVar21 / dVar38;
    dVar37 = dVar37 / dVar38;
    dVar31 = dVar31 / dVar38;
    break;
  default:
    goto switchD_004eee84_default;
  }
  __return_storage_ptr__->m_data[0] = dVar31;
  __return_storage_ptr__->m_data[1] = dVar37;
  __return_storage_ptr__->m_data[2] = dVar21;
switchD_004eee84_default:
  return __return_storage_ptr__;
}

Assistant:

ChVector<double> Quat_to_Angle(AngleSet angset, const ChQuaternion<double>& mquat) {
    ChVector<double> res;
    ChMatrix33<> Acoord(mquat);

    switch (angset) {
        case AngleSet::EULERO:
            res = Acoord.Get_A_Eulero();
            break;
        case AngleSet::CARDANO:
            res = Acoord.Get_A_Cardano();
            break;
        case AngleSet::HPB:
            res = Acoord.Get_A_Hpb();
            break;
        case AngleSet::RXYZ:
            res = Acoord.Get_A_Rxyz();
            break;
        case AngleSet::RODRIGUEZ:
            res = Acoord.Get_A_Rodriguez();
            break;
        default:
            break;
    }
    return res;
}